

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O2

int vs_infers(bitstream *str,int32_t *val,int32_t ival)

{
  if (str->dir != VS_ENCODE) {
    *val = ival;
    return 0;
  }
  if (*val == ival) {
    return 0;
  }
  fprintf(_stderr,"Wrong infered value: %d != %d\n");
  return 1;
}

Assistant:

int vs_infers(struct bitstream *str, int32_t *val, int32_t ival) {
	if (str->dir == VS_ENCODE) {
		if (*val != ival) {
			fprintf (stderr, "Wrong infered value: %d != %d\n", *val, ival);
			return 1;
		}
	} else {
		*val = ival;
	}
	return 0;
}